

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_19cf73a::AV1ResizeXTest_DISABLED_SpeedTest_Test::TestBody
          (AV1ResizeXTest_DISABLED_SpeedTest_Test *this)

{
  uint8_t uVar1;
  int64_t iVar2;
  int64_t iVar3;
  ostream *poVar4;
  int level;
  int iVar5;
  int width2;
  int i;
  int iVar6;
  long lVar7;
  bool bVar8;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  
  for (lVar7 = 0;
      lVar7 < (long)(this->super_AV1ResizeXTest).height_ * (long)(this->super_AV1ResizeXTest).width_
      ; lVar7 = lVar7 + 1) {
    uVar1 = libaom_test::ACMRandom::Rand8(&(this->super_AV1ResizeXTest).rng_);
    (this->super_AV1ResizeXTest).src_._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[lVar7] = uVar1;
  }
  iVar5 = 1;
  while( true ) {
    if ((this->super_AV1ResizeXTest).n_levels_ <= iVar5) break;
    width2 = (this->super_AV1ResizeXTest).width_ >> ((byte)iVar5 & 0x1f);
    ::aom_usec_timer_start(&ref_timer);
    iVar6 = 1000;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      av1_resize_horz_dir_c
                ((this->super_AV1ResizeXTest).src_._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                 (this->super_AV1ResizeXTest).width_,
                 (this->super_AV1ResizeXTest).ref_dest_._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                 (this->super_AV1ResizeXTest).height_,width2 * 2,width2);
    }
    ::aom_usec_timer_mark(&ref_timer);
    iVar2 = ::aom_usec_timer_elapsed(&ref_timer);
    ::aom_usec_timer_start(&tst_timer);
    iVar6 = 1000;
    while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
      (*(this->super_AV1ResizeXTest).test_fun_)
                ((this->super_AV1ResizeXTest).src_._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                 (this->super_AV1ResizeXTest).width_,
                 (this->super_AV1ResizeXTest).test_dest_._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                 (this->super_AV1ResizeXTest).height_,width2 * 2,width2);
    }
    ::aom_usec_timer_mark(&tst_timer);
    iVar3 = ::aom_usec_timer_elapsed(&tst_timer);
    poVar4 = std::operator<<((ostream *)&std::cout,"level: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar5);
    poVar4 = std::operator<<(poVar4," [");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,width2);
    poVar4 = std::operator<<(poVar4," x ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_AV1ResizeXTest).height_);
    poVar4 = std::operator<<(poVar4,"] C time = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," , SIMD time = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    poVar4 = std::operator<<(poVar4," scaling=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)iVar2 / (float)iVar3);
    std::operator<<(poVar4,"x \n");
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

TEST_P(AV1ResizeXTest, DISABLED_SpeedTest) { SpeedTest(); }